

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O3

void __thiscall
cs::statement_struct::statement_struct
          (statement_struct *this,string *name,tree_type<cs::token_base_*> *tree,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *method,context_t *c,
          token_base *ptr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  tree_type<cs::token_base_*> local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  context_t local_b0;
  string local_a0;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_80;
  
  peVar1 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  (this->super_statement_base).line_num = ptr->line_num;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_struct_0025d640;
  local_b8 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)local_b8;
  pcVar3 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar3,pcVar3 + name->_M_string_length);
  local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  pcVar3 = (name->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar3,pcVar3 + name->_M_string_length);
  iVar4 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)tree->mRoot,(EVP_PKEY_CTX *)0x0);
  local_c0.mRoot = (tree_node *)CONCAT44(extraout_var,iVar4);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,method)
  ;
  struct_builder::struct_builder
            (&this->mBuilder,&local_b0,&local_a0,&local_c0,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_80);
  tree_type<cs::token_base_*>::destroy(local_c0.mRoot);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  iVar4 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)tree->mRoot,(EVP_PKEY_CTX *)0x0);
  (this->mParent).mRoot = (tree_node *)CONCAT44(extraout_var_00,iVar4);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (&this->mBlock,method);
  return;
}

Assistant:

statement_struct(const std::string &name, const tree_type<token_base *> &tree,
		                 const std::deque<statement_base *> &method, const context_t &c, token_base *ptr)
			: statement_base(c,
			                 ptr),
			  mName(name),
			  mBuilder(c, name,
			           tree,
			           method),
			  mParent(tree),
			  mBlock(method) {}